

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

ssize_t file_write(archive *a,void *client_data,void *buff,size_t length)

{
  ssize_t sVar1;
  int *piVar2;
  uint *puVar3;
  size_t in_RCX;
  void *in_RDX;
  int *in_RSI;
  archive *in_RDI;
  ssize_t bytesWritten;
  write_file_data *mine;
  
  do {
    sVar1 = write(*in_RSI,in_RDX,in_RCX);
    if (0 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  puVar3 = (uint *)__errno_location();
  archive_set_error(in_RDI,(int)(ulong)*puVar3,"Write error");
  return -1;
}

Assistant:

static ssize_t
file_write(struct archive *a, void *client_data, const void *buff, size_t length)
{
	struct write_fd_data	*mine;
	ssize_t	bytesWritten;

	mine = (struct write_fd_data *)client_data;
	for (;;) {
		bytesWritten = write(mine->fd, buff, length);
		if (bytesWritten <= 0) {
			if (errno == EINTR)
				continue;
			archive_set_error(a, errno, "Write error");
			return (-1);
		}
		return (bytesWritten);
	}
}